

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.hpp
# Opt level: O2

string * vector_utils::to_string<volume_mapping>
                   (string *__return_storage_ptr__,
                   vector<volume_mapping,_std::allocator<volume_mapping>_> *array)

{
  pointer pvVar1;
  volume_mapping *x;
  pointer this;
  string res;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  pvVar1 = (array->super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (array->super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pvVar1; this = this + 1) {
    volume_mapping::to_string_abi_cxx11_(&sStack_68,this);
    std::__cxx11::string::append((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  std::operator+(&sStack_68,"[ ",&local_48);
  std::operator+(__return_storage_ptr__,&sStack_68,"]");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static string to_string(const vector<T>& array) {
    string res;
    for (auto& x : array) {
      res += x.to_string();
    }
    return "[ " + res + "]";
  }